

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O2

string * __thiscall
glcts::ArraysOfArrays::ExpressionsAssignment1<glcts::ArraysOfArrays::Interface::GL>::
recursively_initialise
          (string *__return_storage_ptr__,
          ExpressionsAssignment1<glcts::ArraysOfArrays::Interface::GL> *this,string *var_type,
          size_t dimension_index,string *init_string)

{
  int iVar1;
  size_t indent_index;
  size_t sVar2;
  allocator<char> local_119;
  string *local_118;
  size_t local_110;
  ExpressionsAssignment1<glcts::ArraysOfArrays::Interface::GL> *local_108;
  string *local_100;
  string *local_f8;
  string local_f0;
  string prefix;
  string local_b0 [32];
  string local_90 [32];
  string local_70;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_110 = dimension_index;
  local_108 = this;
  local_100 = var_type;
  if (dimension_index == 0) {
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  }
  else {
    local_118 = __return_storage_ptr__;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&prefix,"\n",(allocator<char> *)&local_f0);
    for (sVar2 = local_110; sVar2 < 9; sVar2 = sVar2 + 1) {
      std::__cxx11::string::append((char *)&prefix);
    }
    std::__cxx11::string::string(local_90,(string *)local_100);
    std::__cxx11::string::string<std::allocator<char>>(local_b0,"[]",&local_119);
    (*(local_108->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.
      super_TestNode._vptr_TestNode[6])(&local_f0,local_108,local_90,local_b0,local_110);
    std::__cxx11::string::append((string *)&prefix);
    local_f8 = init_string;
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string(local_b0);
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::append((char *)&prefix);
    sVar2 = local_110 - 1;
    iVar1 = 3;
    do {
      iVar1 = iVar1 + -1;
      if (iVar1 == 0) break;
      std::__cxx11::string::append((string *)local_118);
      std::__cxx11::string::string((string *)&local_50,(string *)local_100);
      std::__cxx11::string::string((string *)&local_70,(string *)local_f8);
      recursively_initialise(&local_f0,local_108,&local_50,sVar2,&local_70);
      std::__cxx11::string::append((string *)local_118);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::assign((char *)&prefix);
    } while (local_110 != 1);
    __return_storage_ptr__ = local_118;
    std::__cxx11::string::append((char *)local_118);
    std::__cxx11::string::~string((string *)&prefix);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ExpressionsAssignment1<API>::recursively_initialise(std::string var_type, size_t dimension_index,
																std::string init_string)
{
	std::string temp_string;

	if (dimension_index == 0)
	{
		temp_string = init_string;
	}
	else
	{
		std::string prefix = "\n";

		for (size_t indent_index = dimension_index; indent_index < (API::MAX_ARRAY_DIMENSIONS + 1); indent_index++)
		{
			prefix += "    ";
		}

		prefix += this->extend_string(var_type, "[]", dimension_index);
		prefix += "(";
		for (int sub_script_index = 0; sub_script_index < 2; sub_script_index++)
		{
			temp_string += prefix;
			temp_string += recursively_initialise(var_type, dimension_index - 1, init_string);
			prefix = ", ";
			if (dimension_index == 1)
			{
				break;
			}
		}
		temp_string += ")";
	}

	return temp_string;
}